

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O3

void P_LoadThings(MapData *map)

{
  FMapThing *mt;
  ushort uVar1;
  short sVar2;
  FileReader *pFVar3;
  ushort uVar4;
  long lVar5;
  FMapThing *pFVar6;
  Node *pNVar7;
  WORD WVar8;
  uint *puVar9;
  uint uVar10;
  Node *pNVar11;
  uint uVar12;
  uint recordnum;
  uint uVar13;
  ulong uVar14;
  uint *puVar15;
  undefined1 auVar16 [16];
  
  pFVar3 = map->MapLumps[1].Reader;
  if (pFVar3 == (FileReader *)0x0) {
    uVar14 = 0;
  }
  else {
    uVar14 = (ulong)(int)pFVar3->Length;
  }
  puVar9 = (uint *)operator_new__(uVar14);
  lVar5 = pFVar3->Length;
  map->file = pFVar3;
  (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar3,0,0);
  (*(map->file->super_FileReaderBase)._vptr_FileReaderBase[2])(map->file,puVar9,(long)(int)lVar5);
  uVar13 = (uint)(uVar14 / 10);
  if (MapThingsConverted.Count <= uVar13 && uVar13 - MapThingsConverted.Count != 0) {
    TArray<FMapThing,_FMapThing>::Grow(&MapThingsConverted,uVar13 - MapThingsConverted.Count);
  }
  pFVar6 = MapThingsConverted.Array;
  MapThingsConverted.Count = uVar13;
  if (0 < (int)uVar13) {
    uVar14 = 0;
    puVar15 = puVar9;
    do {
      uVar1 = (ushort)puVar15[2];
      recordnum = (uint)(short)uVar1;
      mt = pFVar6 + uVar14;
      memset(mt,0,0x90);
      uVar4 = (ushort)((int)(recordnum << 0x1f) >> 0x1f) & 3;
      WVar8 = uVar4 + 0x18 + (uVar1 & 2) * 2;
      if ((recordnum & 4) == 0) {
        WVar8 = uVar4 + (uVar1 & 2) * 2;
      }
      pFVar6[uVar14].SkillFilter = WVar8;
      pFVar6[uVar14].ClassFilter = 0xffff;
      pFVar6[uVar14].RenderStyle = 0xe;
      pFVar6[uVar14].FloatbobPhase = -1;
      pFVar6[uVar14].Gravity = 1.0;
      (&pFVar6[uVar14].Gravity)[1] = -1.0;
      pFVar6[uVar14].health = 1;
      auVar16 = pshuflw(ZEXT416(*puVar15),ZEXT416(*puVar15),0x60);
      pFVar6[uVar14].pos.X = (double)(auVar16._0_4_ >> 0x10);
      pFVar6[uVar14].pos.Y = (double)(auVar16._4_4_ >> 0x10);
      pFVar6[uVar14].angle = (short)puVar15[1];
      sVar2 = *(short *)((long)puVar15 + 6);
      pFVar6[uVar14].EdNum = sVar2;
      pNVar7 = DoomEdMap.Nodes + (DoomEdMap.Size - 1 & (int)sVar2);
      do {
        pNVar11 = pNVar7;
        if ((pNVar11 == (Node *)0x0) || (pNVar11->Next == (Node *)0x1)) goto LAB_00447181;
        pNVar7 = pNVar11->Next;
      } while ((pNVar11->Pair).Key != (int)sVar2);
      mt->info = &(pNVar11->Pair).Value;
      if ((pNVar11->Pair).Value.Special == 0x19) {
        ProcessEDMapthing(mt,recordnum);
      }
      else {
LAB_00447181:
        uVar12 = uVar1 & 8 | 0x7e0;
        mt->flags = uVar12;
        if (gameinfo.gametype == GAME_Strife) {
          uVar12 = (recordnum >> 2 & 8) +
                   ((recordnum & 8) << 0xb | (recordnum & 0x200) * 8 + (recordnum & 0x100) * 8) +
                   0x7e0;
          mt->flags = uVar12;
          if ((uVar1 & 0x40) != 0) {
            uVar12 = uVar12 | 0x2000;
LAB_00447219:
            mt->flags = uVar12;
          }
        }
        else {
          uVar10 = recordnum & 0x18;
          if ((recordnum >> 8 & 1) == 0) {
            uVar10 = recordnum;
          }
          recordnum = uVar10;
          uVar10 = uVar1 & 8 | 0x3e0;
          if ((recordnum & 0x20) == 0) {
            uVar10 = uVar12;
          }
          uVar12 = uVar10 & 0x5e8;
          if ((recordnum & 0x40) == 0) {
            uVar12 = uVar10;
          }
          uVar12 = (recordnum & 0x80) << 6 | uVar12;
          if ((recordnum & 0xe0) != 0) goto LAB_00447219;
        }
        if ((recordnum & 0x10) != 0) {
          mt->flags = uVar12 & 0x7eff;
        }
      }
      uVar14 = uVar14 + 1;
      puVar15 = (uint *)((long)puVar15 + 10);
    } while (uVar14 != (uVar13 & 0x7fffffff));
  }
  operator_delete__(puVar9);
  return;
}

Assistant:

void P_LoadThings (MapData * map)
{
	int	lumplen = map->Size(ML_THINGS);
	int numthings = lumplen / sizeof(mapthing_t);

	char *mtp;
	mapthing_t *mt;

	mtp = new char[lumplen];
	map->Read(ML_THINGS, mtp);
	mt = (mapthing_t*)mtp;

	MapThingsConverted.Resize(numthings);
	FMapThing *mti = &MapThingsConverted[0];

	// [RH] ZDoom now uses Hexen-style maps as its native format.
	//		Since this is the only place where Doom-style Things are ever
	//		referenced, we translate them into a Hexen-style thing.
	for (int i=0 ; i < numthings; i++, mt++)
	{
		// [RH] At this point, monsters unique to Doom II were weeded out
		//		if the IWAD wasn't for Doom II. P_SpawnMapThing() can now
		//		handle these and more cases better, so we just pass it
		//		everything and let it decide what to do with them.

		// [RH] Need to translate the spawn flags to Hexen format.
		short flags = LittleShort(mt->options);

		memset (&mti[i], 0, sizeof(mti[i]));

		mti[i].Gravity = 1;
		mti[i].Conversation = 0;
		mti[i].SkillFilter = MakeSkill(flags);
		mti[i].ClassFilter = 0xffff;	// Doom map format doesn't have class flags so spawn for all player classes
		mti[i].RenderStyle = STYLE_Count;
		mti[i].Alpha = -1;
		mti[i].health = 1;
		mti[i].FloatbobPhase = -1;

		mti[i].pos.X = LittleShort(mt->x);
		mti[i].pos.Y = LittleShort(mt->y);
		mti[i].angle = LittleShort(mt->angle);
		mti[i].EdNum = LittleShort(mt->type);
		mti[i].info = DoomEdMap.CheckKey(mti[i].EdNum);


#ifndef NO_EDATA
		if (mti[i].info != NULL && mti[i].info->Special == SMT_EDThing)
		{
			ProcessEDMapthing(&mti[i], flags);
		}
		else
#endif
		{
			flags &= ~MTF_SKILLMASK;
			mti[i].flags = (short)((flags & 0xf) | 0x7e0);
			if (gameinfo.gametype == GAME_Strife)
			{
				mti[i].flags &= ~MTF_AMBUSH;
				if (flags & STF_SHADOW)			mti[i].flags |= MTF_SHADOW;
				if (flags & STF_ALTSHADOW)		mti[i].flags |= MTF_ALTSHADOW;
				if (flags & STF_STANDSTILL)		mti[i].flags |= MTF_STANDSTILL;
				if (flags & STF_AMBUSH)			mti[i].flags |= MTF_AMBUSH;
				if (flags & STF_FRIENDLY)		mti[i].flags |= MTF_FRIENDLY;
			}
			else
			{
				if (flags & BTF_BADEDITORCHECK)
				{
					flags &= 0x1F;
				}
				if (flags & BTF_NOTDEATHMATCH)	mti[i].flags &= ~MTF_DEATHMATCH;
				if (flags & BTF_NOTCOOPERATIVE)	mti[i].flags &= ~MTF_COOPERATIVE;
				if (flags & BTF_FRIENDLY)		mti[i].flags |= MTF_FRIENDLY;
			}
			if (flags & BTF_NOTSINGLE)			mti[i].flags &= ~MTF_SINGLE;
		}
	}
	delete [] mtp;
}